

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O0

Formula * Kernel::Formula::falseFormula(void)

{
  int iVar1;
  Formula *pFVar2;
  Formula *in_stack_fffffffffffffff0;
  
  if (falseFormula()::res == '\0') {
    iVar1 = __cxa_guard_acquire(&falseFormula()::res);
    if (iVar1 != 0) {
      pFVar2 = (Formula *)operator_new(0x857028);
      Formula(in_stack_fffffffffffffff0,SUB81((ulong)pFVar2 >> 0x38,0));
      falseFormula::res = pFVar2;
      __cxa_guard_release(&falseFormula()::res);
    }
  }
  return falseFormula::res;
}

Assistant:

Formula* Formula::falseFormula()
{
  static Formula* res = new Formula(false);
  return res;
}